

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxSuper::Resolve(FxSuper *this,FCompileContext *ctx)

{
  Variant *pVVar1;
  FCompileContext *ctx_local;
  FxSuper *this_local;
  
  this_local = this;
  if (((this->super_FxSelf).super_FxExpression.isresolved & 1U) == 0) {
    (this->super_FxSelf).super_FxExpression.isresolved = true;
    if ((ctx->Function == (PFunction *)0x0) ||
       (pVVar1 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                           (&ctx->Function->Variants,0), pVVar1->SelfClass == (PStruct *)0x0)) {
      FScriptPosition::Message
                (&(this->super_FxSelf).super_FxExpression.ScriptPosition,2,
                 "super used outside of a member function");
      if (this != (FxSuper *)0x0) {
        (*(this->super_FxSelf).super_FxExpression._vptr_FxExpression[1])();
      }
      this_local = (FxSuper *)0x0;
    }
    else {
      (this->super_FxSelf).super_FxExpression.ValueType = &TypeError->super_PType;
    }
  }
  return (FxExpression *)this_local;
}

Assistant:

FxExpression *FxSuper::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	if (ctx.Function == nullptr || ctx.Function->Variants[0].SelfClass == nullptr)
	{
		ScriptPosition.Message(MSG_ERROR, "super used outside of a member function");
		delete this;
		return nullptr;
	}
	ValueType = TypeError;	// this intentionally resolves to an invalid type so that it cannot be used outside of super calls.
	return this;
}